

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O1

Formula * Kernel::Formula::quantify(Formula *f)

{
  Entry *pEVar1;
  uint uVar2;
  Term *this;
  bool bVar3;
  pointer pcVar4;
  uint *puVar5;
  pointer pcVar6;
  uint *puVar7;
  pointer pcVar8;
  Formula *pFVar9;
  uint *puVar10;
  uint *puVar11;
  void **head;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> tMap;
  pointer local_98;
  Iterator local_78;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_58;
  
  local_58._timestamp = 1;
  local_58._size = 0;
  local_58._deleted = 0;
  local_58._capacityIndex = 0;
  local_58._capacity = 0;
  local_58._nextExpansionOccupancy = 0;
  local_58._entries._0_4_ = 0;
  local_58._entries._4_4_ = 0;
  local_58._afterLast._0_4_ = 0;
  local_58._afterLast._4_4_ = 0;
  SortHelper::collectVariableSorts(f,&local_58,true);
  local_78._base._next = (Entry *)CONCAT44(local_58._entries._4_4_,local_58._entries._0_4_);
  local_78._base._last = (Entry *)CONCAT44(local_58._afterLast._4_4_,local_58._afterLast._0_4_);
  local_78._base._timestamp = local_58._timestamp;
  local_98 = (pointer)0x0;
  pcVar6 = (pointer)0x0;
  puVar10 = (uint *)0x0;
  puVar11 = (uint *)0x0;
  pcVar8 = local_98;
  while (local_98 = pcVar8, pcVar4 = pcVar6,
        bVar3 = ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                Iterator::hasNext(&local_78), bVar3) {
    pEVar1 = local_78._base._next + 1;
    uVar2 = (local_78._base._next)->_key;
    this = (Term *)((local_78._base._next)->_val)._content;
    local_78._base._next = pEVar1;
    if ((((ulong)this & 3) == 0) && (bVar3 = Term::isSuper(this), bVar3)) {
      puVar7 = (uint *)::Lib::FixedSizeAllocator<16UL>::alloc
                                 ((FixedSizeAllocator<16UL> *)
                                  (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      *puVar7 = uVar2;
      *(uint **)(puVar7 + 2) = puVar11;
      pcVar8 = (pointer)::Lib::FixedSizeAllocator<16UL>::alloc
                                  ((FixedSizeAllocator<16UL> *)
                                   (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      puVar11 = puVar7;
      if (puVar10 != (uint *)0x0) {
        puVar11 = puVar10;
      }
      *(Term **)pcVar8 = this;
      *(pointer *)(pcVar8 + 8) = local_98;
      pcVar6 = pcVar4;
      puVar10 = puVar11;
      puVar11 = puVar7;
      if (pcVar4 == (pointer)0x0) {
        pcVar6 = pcVar8;
      }
    }
    else {
      puVar5 = (uint *)::Lib::FixedSizeAllocator<16UL>::alloc
                                 ((FixedSizeAllocator<16UL> *)
                                  (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      *puVar5 = uVar2;
      puVar5[2] = 0;
      puVar5[3] = 0;
      puVar7 = puVar5;
      if (puVar10 != (uint *)0x0) {
        *(uint **)(puVar10 + 2) = puVar5;
        puVar7 = puVar11;
      }
      puVar11 = puVar7;
      pcVar6 = (pointer)::Lib::FixedSizeAllocator<16UL>::alloc
                                  ((FixedSizeAllocator<16UL> *)
                                   (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      *(Term **)pcVar6 = this;
      pcVar6[8] = '\0';
      pcVar6[9] = '\0';
      pcVar6[10] = '\0';
      pcVar6[0xb] = '\0';
      pcVar6[0xc] = '\0';
      pcVar6[0xd] = '\0';
      pcVar6[0xe] = '\0';
      pcVar6[0xf] = '\0';
      puVar10 = puVar5;
      pcVar8 = pcVar6;
      if (pcVar4 != (pointer)0x0) {
        *(pointer *)(pcVar4 + 8) = pcVar6;
        pcVar8 = local_98;
      }
    }
  }
  if (puVar11 != (uint *)0x0) {
    pFVar9 = (Formula *)
             ::Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    pFVar9->_connective = FORALL;
    (pFVar9->_label)._M_dataplus._M_p = (pointer)&(pFVar9->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar9->_label,DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + DEFAULT_LABEL_abi_cxx11_);
    *(uint **)(pFVar9 + 1) = puVar11;
    pFVar9[1]._label._M_dataplus._M_p = local_98;
    pFVar9[1]._label._M_string_length = (size_type)f;
    f = pFVar9;
  }
  ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&local_58);
  return f;
}

Assistant:

Formula* Formula::quantify(Formula* f)
{

  DHMap<unsigned,TermList> tMap;
  SortHelper::collectVariableSorts(f,tMap,/*ignoreBound=*/true);

  //we have to quantify the formula
  VList::FIFO quantifiedVars;
  SList::FIFO theirSorts;

  DHMap<unsigned,TermList>::Iterator tmit(tMap);
  while(tmit.hasNext()) {
    unsigned v;
    TermList s;
    tmit.next(v, s);
    if(s.isTerm() && s.term()->isSuper()){
      // type variable must appear at the start of the list
      quantifiedVars.pushFront(v);
      theirSorts.pushFront(s);
    } else {
      quantifiedVars.pushBack(v);
      theirSorts.pushBack(s);
    }
  }
  if(!quantifiedVars.empty()) {
    f = new QuantifiedFormula(FORALL, quantifiedVars.list(), theirSorts.list(), f);
  }
  return f;
}